

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSTLUtil.hpp
# Opt level: O0

bool de::
     insert<std::map<std::__cxx11::string,de::SharedPtr<unsigned_char>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,de::SharedPtr<unsigned_char>>>>>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
                *map,key_type *key,mapped_type *value)

{
  __enable_if_t<is_constructible<value_type,_pair<const_basic_string<char>,_SharedPtr<unsigned_char>_>_&>::value,_pair<iterator,_bool>_>
  _Var1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_bool>
  ret;
  value_type entry;
  mapped_type *value_local;
  key_type *key_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *map_local;
  
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>
              *)&ret.second,key,value);
  _Var1 = std::
          map<std::__cxx11::string,de::SharedPtr<unsigned_char>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,de::SharedPtr<unsigned_char>>>>
          ::insert<std::pair<std::__cxx11::string_const,de::SharedPtr<unsigned_char>>&>
                    ((map<std::__cxx11::string,de::SharedPtr<unsigned_char>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,de::SharedPtr<unsigned_char>>>>
                      *)map,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>
                             *)&ret.second);
  ret.first._M_node._0_1_ = _Var1.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>
           *)&ret.second);
  return (bool)(_Var1.second & 1);
}

Assistant:

bool insert (M& map, const typename M::key_type& key, const typename M::mapped_type& value)
{
	typename M::value_type entry(key, value);
	std::pair<typename M::iterator,bool> ret = map.insert(entry);
	return ret.second;
}